

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall
flatbuffers::swift::SwiftGenerator::BuildingOptionalObjects
          (SwiftGenerator *this,string *var,string *body_front)

{
  CodeWriter *this_00;
  int *piVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_148;
  string local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::operator+(&bStack_148,"let __",var);
  std::operator+(&local_68,&bStack_148,": Offset");
  this_00 = &this->code_;
  CodeWriter::operator+=(this_00,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&bStack_148);
  std::operator+(&bStack_148,"if let s = obj.",var);
  std::operator+(&local_88,&bStack_148," {");
  CodeWriter::operator+=(this_00,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&bStack_148);
  piVar1 = &(this->code_).cur_ident_lvl_;
  *piVar1 = *piVar1 + 1;
  std::operator+(&local_48,"__",var);
  std::operator+(&bStack_148,&local_48," = ");
  std::operator+(&local_a8,&bStack_148,body_front);
  CodeWriter::operator+=(this_00,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&bStack_148);
  std::__cxx11::string::~string((string *)&local_48);
  iVar2 = (this->code_).cur_ident_lvl_;
  if (iVar2 != 0) {
    (this->code_).cur_ident_lvl_ = iVar2 + -1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"} else {",(allocator<char> *)&bStack_148);
  CodeWriter::operator+=(this_00,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  piVar1 = &(this->code_).cur_ident_lvl_;
  *piVar1 = *piVar1 + 1;
  std::operator+(&bStack_148,"__",var);
  std::operator+(&local_e8,&bStack_148," = Offset()");
  CodeWriter::operator+=(this_00,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&bStack_148);
  iVar2 = (this->code_).cur_ident_lvl_;
  if (iVar2 != 0) {
    (this->code_).cur_ident_lvl_ = iVar2 + -1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"}",(allocator<char> *)&bStack_148);
  CodeWriter::operator+=(this_00,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"",(allocator<char> *)&bStack_148);
  CodeWriter::operator+=(this_00,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  return;
}

Assistant:

void BuildingOptionalObjects(const std::string &var,
                               const std::string &body_front) {
    code_ += "let __" + var + ": Offset";
    code_ += "if let s = obj." + var + " {";
    Indent();
    code_ += "__" + var + " = " + body_front;
    Outdent();
    code_ += "} else {";
    Indent();
    code_ += "__" + var + " = Offset()";
    Outdent();
    code_ += "}";
    code_ += "";
  }